

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

void __thiscall XMISong::XMISong(XMISong *this,XMISong *original,char *filename,EMidiDevice type)

{
  int iVar1;
  uint uVar2;
  BYTE *__src;
  TrackInfo *pTVar3;
  BYTE *__dest;
  TrackInfo *pTVar4;
  long lVar5;
  ulong uVar6;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__XMISong_006ea8f8;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array = (AutoNoteOff *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Most = 0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  iVar1 = original->SongLen;
  this->SongLen = iVar1;
  __dest = (BYTE *)operator_new__((long)iVar1);
  this->MusHeader = __dest;
  __src = original->MusHeader;
  memcpy(__dest,__src,(long)iVar1);
  uVar2 = original->NumSongs;
  this->NumSongs = uVar2;
  iVar1 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar1;
  (this->super_MIDIStreamer).Tempo = iVar1;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar2) {
    uVar6 = (long)(int)uVar2 << 7;
  }
  pTVar4 = (TrackInfo *)operator_new__(uVar6);
  this->Songs = pTVar4;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  for (; uVar6 * 0x80 != lVar5; lVar5 = lVar5 + 0x80) {
    pTVar3 = original->Songs;
    *(BYTE **)((long)pTVar4->ForLoops + lVar5 + -0x38) =
         __dest + (*(long *)((long)pTVar3->ForLoops + lVar5 + -0x38) - (long)__src);
    *(undefined8 *)((long)(pTVar4->ForLoops + -3) + lVar5) =
         *(undefined8 *)((long)(pTVar3->ForLoops + -3) + lVar5);
    *(undefined8 *)((long)pTVar4->ForLoops + lVar5 + -0x28) = 0;
    *(BYTE **)((long)(pTVar4->ForLoops + -2) + lVar5) =
         __dest + (*(long *)((long)(pTVar3->ForLoops + -2) + lVar5) - (long)__src);
    *(undefined8 *)((long)pTVar4->ForLoops + lVar5 + -0x18) =
         *(undefined8 *)((long)pTVar3->ForLoops + lVar5 + -0x18);
  }
  return;
}

Assistant:

XMISong::XMISong(const XMISong *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	NumSongs = original->NumSongs;
	Tempo = InitialTempo = original->InitialTempo;
	Songs = new TrackInfo[NumSongs];
	for (int i = 0; i < NumSongs; ++i)
	{
		TrackInfo *newtrack = &Songs[i];
		const TrackInfo *oldtrack = &original->Songs[i];

		newtrack->EventChunk = MusHeader + (oldtrack->EventChunk - original->MusHeader);
		newtrack->EventLen = oldtrack->EventLen;
		newtrack->EventP = 0;

		newtrack->TimbreChunk = MusHeader + (oldtrack->TimbreChunk - original->MusHeader);
		newtrack->TimbreLen = oldtrack->TimbreLen;
	}
}